

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_service.c
# Opt level: O2

RcbInfo * mpp_service_next_rcb_info(MppDevMppService *p)

{
  uint uVar1;
  RcbInfo *pRVar2;
  int iVar3;
  int iVar4;
  
  uVar1 = p->rcb_max;
  iVar4 = p->rcb_count;
  iVar3 = p->rcb_pos + iVar4;
  if (iVar3 < (int)uVar1) {
    pRVar2 = p->rcb_info;
  }
  else {
    if (((byte)mpp_device_debug & 0x40) != 0) {
      _mpp_log_l(4,"mpp_serivce","enlarge rcb info count %d -> %d\n",(char *)0x0,(ulong)uVar1,
                 (ulong)(uVar1 * 2));
      uVar1 = p->rcb_max;
    }
    pRVar2 = (RcbInfo *)
             mpp_osal_realloc("mpp_service_next_rcb_info",p->rcb_info,(long)(int)(uVar1 * 2) << 3);
    p->rcb_info = pRVar2;
    if (pRVar2 == (RcbInfo *)0x0) {
      _mpp_log_l(2,"mpp_serivce","failed to enlarge request buffer\n","mpp_service_next_rcb_info");
      return (RcbInfo *)0x0;
    }
    p->rcb_max = p->rcb_max << 1;
    iVar4 = p->rcb_count;
    iVar3 = p->rcb_pos + iVar4;
  }
  if (((byte)mpp_device_debug & 0x40) != 0) {
    _mpp_log_l(4,"mpp_serivce","rcb info %d : %d\n",(char *)0x0);
    iVar4 = p->rcb_count;
  }
  p->rcb_count = iVar4 + 1;
  return pRVar2 + iVar3;
}

Assistant:

RcbInfo *mpp_service_next_rcb_info(MppDevMppService *p)
{
    RcbInfo *info = NULL;

    if (p->rcb_count + p->rcb_pos >= p->rcb_max) {
        mpp_dev_dbg_msg("enlarge rcb info count %d -> %d\n",
                        p->rcb_max, p->rcb_max * 2);
        p->rcb_info = mpp_realloc(p->rcb_info, RcbInfo, p->rcb_max * 2);
        if (NULL == p->rcb_info) {
            mpp_err_f("failed to enlarge request buffer\n");
            return NULL;
        }

        p->rcb_max *= 2;
    }

    info = &p->rcb_info[p->rcb_count + p->rcb_pos];
    mpp_dev_dbg_msg("rcb info %d : %d\n", p->rcb_pos, p->rcb_count);
    p->rcb_count++;

    return info;
}